

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O2

void __thiscall Simplex::printU(Simplex *this)

{
  uint uVar1;
  vec<IndexVal> *pvVar2;
  ulong uVar3;
  long lVar4;
  uint j;
  int i;
  ulong uVar5;
  
  fwrite("U:\n",3,1,_stderr);
  for (uVar5 = 0; uVar3 = (ulong)this->m, (long)uVar5 < (long)uVar3; uVar5 = uVar5 + 1) {
    if ((this->U_rows).data[uVar5].sz != 0) {
      fprintf(_stderr,"row %d: ",uVar5 & 0xffffffff);
    }
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      pvVar2 = (this->U_rows).data;
      uVar1 = pvVar2[uVar5].sz;
      if (uVar1 <= uVar3) break;
      fprintf(_stderr,"%d:%.3Lf ",
              (ulong)*(uint *)((long)&(pvVar2[uVar5].data)->field_0 + lVar4 + 0xc));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    }
    if (uVar1 != 0) {
      fputc(10,_stderr);
    }
  }
  for (uVar5 = 0; (long)uVar5 < (long)(int)uVar3; uVar5 = uVar5 + 1) {
    if ((this->U_cols).data[uVar5].sz != 0) {
      fprintf(_stderr,"col %d: ",uVar5 & 0xffffffff);
    }
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      pvVar2 = (this->U_cols).data;
      uVar1 = pvVar2[uVar5].sz;
      if (uVar1 <= uVar3) break;
      fprintf(_stderr,"%d:%.3Lf ",
              (ulong)*(uint *)((long)&(pvVar2[uVar5].data)->field_0 + lVar4 + 0xc));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    }
    if (uVar1 != 0) {
      fputc(10,_stderr);
    }
    uVar3 = (ulong)(uint)this->m;
  }
  fwrite("diag: ",6,1,_stderr);
  for (uVar5 = 0; (long)uVar5 < (long)this->m; uVar5 = uVar5 + 1) {
    fprintf(_stderr,"%d:%.3Lf ",uVar5 & 0xffffffff);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void Simplex::printU() {
	fprintf(stderr, "U:\n");
	for (int i = 0; i < m; i++) {
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "row %d: ", i);
		}
		for (unsigned int j = 0; j < U_rows[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_rows[i][j].index(), U_rows[i][j].val());
		}
		if (U_rows[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	for (int i = 0; i < m; i++) {
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "col %d: ", i);
		}
		for (unsigned int j = 0; j < U_cols[i].size(); j++) {
			fprintf(stderr, "%d:%.3Lf ", U_cols[i][j].index(), U_cols[i][j].val());
		}
		if (U_cols[i].size() != 0) {
			fprintf(stderr, "\n");
		}
	}
	fprintf(stderr, "diag: ");
	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d:%.3Lf ", i, U_diag[i]);
	}
	fprintf(stderr, "\n");
}